

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalize_func.c
# Opt level: O0

void xc_mgga_vars_allocate_all
               (int family,size_t np,xc_dimensions *dim,int do_zk,int do_vrho,int do_v2rho2,
               int do_v3rho3,int do_v4rho4,double **zk,double **vrho,double **vsigma,double **vlapl,
               double **vtau,double **v2rho2,double **v2rhosigma,double **v2rholapl,
               double **v2rhotau,double **v2sigma2,double **v2sigmalapl,double **v2sigmatau,
               double **v2lapl2,double **v2lapltau,double **v2tau2,double **v3rho3,
               double **v3rho2sigma,double **v3rho2lapl,double **v3rho2tau,double **v3rhosigma2,
               double **v3rhosigmalapl,double **v3rhosigmatau,double **v3rholapl2,
               double **v3rholapltau,double **v3rhotau2,double **v3sigma3,double **v3sigma2lapl,
               double **v3sigma2tau,double **v3sigmalapl2,double **v3sigmalapltau,
               double **v3sigmatau2,double **v3lapl3,double **v3lapl2tau,double **v3lapltau2,
               double **v3tau3,double **v4rho4,double **v4rho3sigma,double **v4rho3lapl,
               double **v4rho3tau,double **v4rho2sigma2,double **v4rho2sigmalapl,
               double **v4rho2sigmatau,double **v4rho2lapl2,double **v4rho2lapltau,
               double **v4rho2tau2,double **v4rhosigma3,double **v4rhosigma2lapl,
               double **v4rhosigma2tau,double **v4rhosigmalapl2,double **v4rhosigmalapltau,
               double **v4rhosigmatau2,double **v4rholapl3,double **v4rholapl2tau,
               double **v4rholapltau2,double **v4rhotau3,double **v4sigma4,double **v4sigma3lapl,
               double **v4sigma3tau,double **v4sigma2lapl2,double **v4sigma2lapltau,
               double **v4sigma2tau2,double **v4sigmalapl3,double **v4sigmalapl2tau,
               double **v4sigmalapltau2,double **v4sigmatau3,double **v4lapl4,double **v4lapl3tau,
               double **v4lapl2tau2,double **v4lapltau3,double **v4tau4)

{
  void *pvVar1;
  double *pdVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_stack_00000020;
  undefined8 *in_stack_00000028;
  undefined4 in_stack_00000034;
  undefined4 in_stack_0000003c;
  
  if (in_ECX != 0) {
    pvVar1 = malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x10));
    *(void **)np = pvVar1;
    memset(*(void **)np,0,*(int *)(in_RDX + 0x10) * in_RSI * 8);
  }
  if (in_R8D != 0) {
    pvVar1 = malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x14));
    *(void **)CONCAT44(family,in_stack_00000020) = pvVar1;
    memset(*(void **)CONCAT44(family,in_stack_00000020),0,*(int *)(in_RDX + 0x14) * in_RSI * 8);
    if ((((in_EDI == 2) || (in_EDI == 0x20)) || (in_EDI == 4)) || (in_EDI == 0x40)) {
      pvVar1 = malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x18));
      *in_stack_00000028 = pvVar1;
      memset((void *)*in_stack_00000028,0,*(int *)(in_RDX + 0x18) * in_RSI * 8);
    }
    if ((in_EDI == 4) || (in_EDI == 0x40)) {
      pvVar1 = malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x1c));
      *(void **)CONCAT44(in_stack_00000034,do_v3rho3) = pvVar1;
      memset(*(void **)CONCAT44(in_stack_00000034,do_v3rho3),0,*(int *)(in_RDX + 0x1c) * in_RSI * 8)
      ;
      pvVar1 = malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x20));
      *(void **)CONCAT44(in_stack_0000003c,do_v4rho4) = pvVar1;
      memset(*(void **)CONCAT44(in_stack_0000003c,do_v4rho4),0,*(int *)(in_RDX + 0x20) * in_RSI * 8)
      ;
    }
  }
  if (in_R9D != 0) {
    pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x24));
    *zk = pdVar2;
    memset(*zk,0,*(int *)(in_RDX + 0x24) * in_RSI * 8);
    if (((in_EDI == 2) || (in_EDI == 0x20)) || ((in_EDI == 4 || (in_EDI == 0x40)))) {
      pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x28));
      *vrho = pdVar2;
      memset(*vrho,0,*(int *)(in_RDX + 0x28) * in_RSI * 8);
      pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x34));
      *vtau = pdVar2;
      memset(*vtau,0,*(int *)(in_RDX + 0x34) * in_RSI * 8);
    }
    if ((in_EDI == 4) || (in_EDI == 0x40)) {
      pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x2c));
      *vsigma = pdVar2;
      memset(*vsigma,0,*(int *)(in_RDX + 0x2c) * in_RSI * 8);
      pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x30));
      *vlapl = pdVar2;
      memset(*vlapl,0,*(int *)(in_RDX + 0x30) * in_RSI * 8);
      pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x38));
      *v2rho2 = pdVar2;
      memset(*v2rho2,0,*(int *)(in_RDX + 0x38) * in_RSI * 8);
      pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x3c));
      *v2rhosigma = pdVar2;
      memset(*v2rhosigma,0,*(int *)(in_RDX + 0x3c) * in_RSI * 8);
      pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x40));
      *v2rholapl = pdVar2;
      memset(*v2rholapl,0,*(int *)(in_RDX + 0x40) * in_RSI * 8);
      pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x44));
      *v2rhotau = pdVar2;
      memset(*v2rhotau,0,*(int *)(in_RDX + 0x44) * in_RSI * 8);
      pdVar2 = (double *)malloc(in_RSI * 8 * (long)*(int *)(in_RDX + 0x48));
      *v2sigma2 = pdVar2;
      memset(*v2sigma2,0,*(int *)(in_RDX + 0x48) * in_RSI * 8);
    }
  }
  return;
}

Assistant:

void
xc_mgga_vars_allocate_all(int family, size_t np, const xc_dimensions *dim,
                     int do_zk, int do_vrho, int do_v2rho2, int do_v3rho3, int do_v4rho4,
                     double **zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA double **, ))
{
  /* allocate buffers */
  if(do_zk){
    *zk = (double *) libxc_malloc(sizeof(double)*np*dim->zk);
    libxc_memset(*zk, 0, dim->zk*np*sizeof(double));
  }

#ifndef XC_DONT_COMPILE_VXC
  if(do_vrho){
    *vrho = (double *) libxc_malloc(sizeof(double)*np*dim->vrho);
    libxc_memset(*vrho,   0, dim->vrho  *np*sizeof(double));
    if(is_gga(family)){
      *vsigma = (double *) libxc_malloc(sizeof(double)*np*dim->vsigma);
      libxc_memset(*vsigma, 0, dim->vsigma*np*sizeof(double));
    }
    if(is_mgga(family)){
      *vlapl = (double *) libxc_malloc(sizeof(double)*np*dim->vlapl);
      libxc_memset(*vlapl,  0, dim->vlapl *np*sizeof(double));
      *vtau  = (double *) libxc_malloc(sizeof(double)*np*dim->vtau);
      libxc_memset(*vtau,   0, dim->vtau  *np*sizeof(double));
    }
  }

#ifndef XC_DONT_COMPILE_FXC
  if(do_v2rho2){
    *v2rho2 = (double *) libxc_malloc(sizeof(double)*np*dim->v2rho2);
     libxc_memset(*v2rho2,     0, dim->v2rho2     *np*sizeof(double));
    if(is_gga(family)){
      *v2rhosigma  = (double *) libxc_malloc(sizeof(double)*np*dim->v2rhosigma);
      libxc_memset(*v2rhosigma, 0, dim->v2rhosigma *np*sizeof(double));
      *v2sigma2    = (double *) libxc_malloc(sizeof(double)*np*dim->v2sigma2);
      libxc_memset(*v2sigma2,   0, dim->v2sigma2   *np*sizeof(double));
    }
    if(is_mgga(family)){
      *v2rholapl   = (double *) libxc_malloc(sizeof(double)*np*dim->v2rholapl);
      libxc_memset(*v2rholapl,   0, dim->v2rholapl  *np*sizeof(double));
      *v2rhotau    = (double *) libxc_malloc(sizeof(double)*np*dim->v2rhotau);
      libxc_memset(*v2rhotau,   0, dim->v2rhotau   *np*sizeof(double));
      *v2sigmalapl = (double *) libxc_malloc(sizeof(double)*np*dim->v2sigmalapl);
      libxc_memset(*v2sigmalapl, 0, dim->v2sigmalapl*np*sizeof(double));
      *v2sigmatau  = (double *) libxc_malloc(sizeof(double)*np*dim->v2sigmatau);
      libxc_memset(*v2sigmatau, 0, dim->v2sigmatau *np*sizeof(double));
      *v2lapl2     = (double *) libxc_malloc(sizeof(double)*np*dim->v2lapl2);
      libxc_memset(*v2lapl2,     0, dim->v2lapl2    *np*sizeof(double));
      *v2lapltau   = (double *) libxc_malloc(sizeof(double)*np*dim->v2lapltau);
      libxc_memset(*v2lapltau,   0, dim->v2lapltau  *np*sizeof(double));
      *v2tau2      = (double *) libxc_malloc(sizeof(double)*np*dim->v2tau2);
      libxc_memset(*v2tau2,     0, dim->v2tau2     *np*sizeof(double));
    }
  }

#ifndef XC_DONT_COMPILE_KXC
  if(do_v3rho3){
    *v3rho3      = (double *) libxc_malloc(sizeof(double)*np*dim->v3rho3);
    libxc_memset(*v3rho3,        0, dim->v3rho3       *np*sizeof(double));
    if(is_gga(family)){
      *v3rho2sigma = (double *) libxc_malloc(sizeof(double)*np*dim->v3rho2sigma);
      libxc_memset(*v3rho2sigma,   0, dim->v3rho2sigma  *np*sizeof(double));
      *v3rhosigma2 = (double *) libxc_malloc(sizeof(double)*np*dim->v3rhosigma2);
      libxc_memset(*v3rhosigma2,   0, dim->v3rhosigma2  *np*sizeof(double));
      *v3sigma3    = (double *) libxc_malloc(sizeof(double)*np*dim->v3sigma3);
      libxc_memset(*v3sigma3,      0, dim->v3sigma3     *np*sizeof(double));
    }
    if(is_mgga(family)){
      *v3rho2lapl     = (double *) libxc_malloc(sizeof(double)*np*dim->v3rho2lapl);
      libxc_memset(*v3rho2lapl,     0, dim->v3rho2lapl    *np*sizeof(double));
      *v3rho2tau      = (double *) libxc_malloc(sizeof(double)*np*dim->v3rho2tau);
      libxc_memset(*v3rho2tau,     0, dim->v3rho2tau    *np*sizeof(double));
      *v3rhosigmalapl = (double *) libxc_malloc(sizeof(double)*np*dim->v3rhosigmalapl);
      libxc_memset(*v3rhosigmalapl, 0, dim->v3rhosigmalapl*np*sizeof(double));
      *v3rhosigmatau  = (double *) libxc_malloc(sizeof(double)*np*dim->v3rhosigmatau);
      libxc_memset(*v3rhosigmatau, 0, dim->v3rhosigmatau*np*sizeof(double));
      *v3rholapl2     = (double *) libxc_malloc(sizeof(double)*np*dim->v3rholapl2);
      libxc_memset(*v3rholapl2,     0, dim->v3rholapl2    *np*sizeof(double));
      *v3rholapltau   = (double *) libxc_malloc(sizeof(double)*np*dim->v3rholapltau);
      libxc_memset(*v3rholapltau,   0, dim->v3rholapltau  *np*sizeof(double));
      *v3rhotau2      = (double *) libxc_malloc(sizeof(double)*np*dim->v3rhotau2);
      libxc_memset(*v3rhotau2,     0, dim->v3rhotau2    *np*sizeof(double));
      *v3sigma2lapl   = (double *) libxc_malloc(sizeof(double)*np*dim->v3sigma2lapl);
      libxc_memset(*v3sigma2lapl,   0, dim->v3sigma2lapl  *np*sizeof(double));
      *v3sigma2tau    = (double *) libxc_malloc(sizeof(double)*np*dim->v3sigma2tau);
      libxc_memset(*v3sigma2tau,   0, dim->v3sigma2tau  *np*sizeof(double));
      *v3sigmalapl2   = (double *) libxc_malloc(sizeof(double)*np*dim->v3sigmalapl2);
      libxc_memset(*v3sigmalapl2,   0, dim->v3sigmalapl2  *np*sizeof(double));
      *v3sigmalapltau = (double *) libxc_malloc(sizeof(double)*np*dim->v3sigmalapltau);
      libxc_memset(*v3sigmalapltau, 0, dim->v3sigmalapltau*np*sizeof(double));
      *v3sigmatau2    = (double *) libxc_malloc(sizeof(double)*np*dim->v3sigmatau2);
      libxc_memset(*v3sigmatau2,   0, dim->v3sigmatau2  *np*sizeof(double));
      *v3lapl3        = (double *) libxc_malloc(sizeof(double)*np*dim->v3lapl3);
      libxc_memset(*v3lapl3,        0, dim->v3lapl3       *np*sizeof(double));
      *v3lapl2tau     = (double *) libxc_malloc(sizeof(double)*np*dim->v3lapl2tau);
      libxc_memset(*v3lapl2tau,     0, dim->v3lapl2tau    *np*sizeof(double));
      *v3lapltau2     = (double *) libxc_malloc(sizeof(double)*np*dim->v3lapltau2);
      libxc_memset(*v3lapltau2,     0, dim->v3lapltau2    *np*sizeof(double));
      *v3tau3         = (double *) libxc_malloc(sizeof(double)*np*dim->v3tau3);
      libxc_memset(*v3tau3,        0, dim->v3tau3       *np*sizeof(double));
    }
  }

#ifndef XC_DONT_COMPILE_LXC
  if(do_v4rho4){
    *v4rho4            = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho4);
    libxc_memset(*v4rho4,         0, dim->v4rho4        *np*sizeof(double));
    if(is_gga(family)){
      *v4rho3sigma       = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho3sigma);
      libxc_memset(*v4rho3sigma,    0, dim->v4rho3sigma   *np*sizeof(double));
      *v4rho2sigma2      = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho2sigma2);
      libxc_memset(*v4rho2sigma2,   0, dim->v4rho2sigma2  *np*sizeof(double));
      *v4rhosigma3       = (double *) libxc_malloc(sizeof(double)*np*dim->v4rhosigma3);
      libxc_memset(*v4rhosigma3,    0, dim->v4rhosigma3   *np*sizeof(double));
      *v4sigma4          = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigma4);
      libxc_memset(*v4sigma4,       0, dim->v4sigma4      *np*sizeof(double));
    }
    if(is_mgga(family)){
      *v4rho3lapl        = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho3lapl);
      libxc_memset(*v4rho3lapl,        0, dim->v4rho3lapl       *np*sizeof(double));
      *v4rho3tau         = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho3tau);
      libxc_memset(*v4rho3tau,      0, dim->v4rho3tau     *np*sizeof(double));
      *v4rho2sigmalapl   = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho2sigmalapl);
      libxc_memset(*v4rho2sigmalapl,   0, dim->v4rho2sigmalapl  *np*sizeof(double));
      *v4rho2sigmatau    = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho2sigmatau);
      libxc_memset(*v4rho2sigmatau, 0, dim->v4rho2sigmatau*np*sizeof(double));
      *v4rho2lapl2       = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho2lapl2);
      libxc_memset(*v4rho2lapl2,       0, dim->v4rho2lapl2      *np*sizeof(double));
      *v4rho2lapltau     = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho2lapltau);
      libxc_memset(*v4rho2lapltau,     0, dim->v4rho2lapltau    *np*sizeof(double));
      *v4rho2tau2        = (double *) libxc_malloc(sizeof(double)*np*dim->v4rho2tau2);
      libxc_memset(*v4rho2tau2,     0, dim->v4rho2tau2    *np*sizeof(double));
      *v4rhosigma2lapl   = (double *) libxc_malloc(sizeof(double)*np*dim->v4rhosigma2lapl);
      libxc_memset(*v4rhosigma2lapl,   0, dim->v4rhosigma2lapl  *np*sizeof(double));
      *v4rhosigma2tau    = (double *) libxc_malloc(sizeof(double)*np*dim->v4rhosigma2tau);
      libxc_memset(*v4rho2sigmatau, 0, dim->v4rho2sigmatau*np*sizeof(double));
      *v4rhosigmalapl2   = (double *) libxc_malloc(sizeof(double)*np*dim->v4rhosigmalapl2);
      libxc_memset(*v4rhosigmalapl2,   0, dim->v4rhosigmalapl2  *np*sizeof(double));
      *v4rhosigmalapltau = (double *) libxc_malloc(sizeof(double)*np*dim->v4rhosigmalapltau);
      libxc_memset(*v4rhosigmalapltau, 0, dim->v4rhosigmalapltau*np*sizeof(double));
      *v4rhosigmatau2    = (double *) libxc_malloc(sizeof(double)*np*dim->v4rhosigmatau2);
      libxc_memset(*v4rhosigmatau2, 0, dim->v4rhosigmatau2*np*sizeof(double));
      *v4rholapl3        = (double *) libxc_malloc(sizeof(double)*np*dim->v4rholapl3);
      libxc_memset(*v4rholapl3,        0, dim->v4rholapl3       *np*sizeof(double));
      *v4rholapl2tau     = (double *) libxc_malloc(sizeof(double)*np*dim->v4rholapl2tau);
      libxc_memset(*v4rholapl2tau,     0, dim->v4rholapl2tau    *np*sizeof(double));
      *v4rholapltau2     = (double *) libxc_malloc(sizeof(double)*np*dim->v4rholapltau2);
      libxc_memset(*v4rholapltau2,     0, dim->v4rholapltau2    *np*sizeof(double));
      *v4rhotau3         = (double *) libxc_malloc(sizeof(double)*np*dim->v4rhotau3);
      libxc_memset(*v4rhotau3,      0, dim->v4rhotau3     *np*sizeof(double));
      *v4sigma3lapl      = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigma3lapl);
      libxc_memset(*v4sigma3lapl,      0, dim->v4sigma3lapl     *np*sizeof(double));
      *v4sigma3tau       = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigma3tau);
      libxc_memset(*v4sigma3tau,    0, dim->v4sigma3tau   *np*sizeof(double));
      *v4sigma2lapl2     = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigma2lapl2);
      libxc_memset(*v4sigma2lapl2,     0, dim->v4sigma2lapl2    *np*sizeof(double));
      *v4sigma2lapltau   = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigma2lapltau);
      libxc_memset(*v4sigma2lapltau,   0, dim->v4sigma2lapltau  *np*sizeof(double));
      *v4sigma2tau2      = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigma2tau2);
      libxc_memset(*v4sigma2tau2,   0, dim->v4sigma2tau2  *np*sizeof(double));
      *v4sigmalapl3      = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigmalapl3);
      libxc_memset(*v4sigmalapl3,      0, dim->v4sigmalapl3     *np*sizeof(double));
      *v4sigmalapl2tau   = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigmalapl2tau);
      libxc_memset(*v4sigmalapl2tau,   0, dim->v4sigmalapl2tau  *np*sizeof(double));
      *v4sigmalapltau2   = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigmalapltau2);
      libxc_memset(*v4sigmalapl2tau,   0, dim->v4sigmalapl2tau  *np*sizeof(double));
      *v4sigmatau3       = (double *) libxc_malloc(sizeof(double)*np*dim->v4sigmatau3);
      libxc_memset(*v4sigmatau3,    0, dim->v4sigmatau3   *np*sizeof(double));
      *v4lapl4           = (double *) libxc_malloc(sizeof(double)*np*dim->v4lapl4);
      libxc_memset(*v4lapl4,           0, dim->v4lapl4          *np*sizeof(double));
      *v4lapl3tau        = (double *) libxc_malloc(sizeof(double)*np*dim->v4lapl3tau);
      libxc_memset(*v4lapl3tau,        0, dim->v4lapl3tau       *np*sizeof(double));
      *v4lapl2tau2       = (double *) libxc_malloc(sizeof(double)*np*dim->v4lapl2tau2);
      libxc_memset(*v4lapl2tau2,       0, dim->v4lapl2tau2      *np*sizeof(double));
      *v4lapltau3        = (double *) libxc_malloc(sizeof(double)*np*dim->v4lapltau3);
      libxc_memset(*v4lapltau3,        0, dim->v4lapltau3       *np*sizeof(double));
      *v4tau4            = (double *) libxc_malloc(sizeof(double)*np*dim->v4tau4);
      libxc_memset(*v4tau4,         0, dim->v4tau4        *np*sizeof(double));
    }
  }
#endif
#endif
#endif
#endif
}